

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O3

int Cudd_DumpDaVinci(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  DdNode *pDVar1;
  DdNode **ppDVar2;
  int iVar3;
  FILE *fp_00;
  st__generator *gen;
  char *pcVar4;
  char **names;
  FILE *mask;
  ulong uVar5;
  char **ppcVar6;
  uint uVar7;
  bool bVar8;
  DdNode *scan;
  char *local_50;
  ulong local_48;
  DdNode **local_40;
  st__table *local_38;
  
  mask = fp;
  local_38 = (st__table *)inames;
  fp_00 = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
  if (fp_00 != (FILE *)0x0) {
    if (0 < n) {
      uVar7 = 0;
      uVar5 = 0;
      do {
        iVar3 = cuddCollectNodes((DdNode *)((ulong)f[uVar5] & 0xfffffffffffffffe),(st__table *)fp_00
                                );
        if (iVar3 == 0) goto LAB_007d63bf;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
    pDVar1 = *f;
    local_40 = f;
    gen = st__init_gen((st__table *)fp_00);
    iVar3 = st__gen(gen,&local_50,(char **)0x0);
    ppcVar6 = (char **)0x0;
    if (iVar3 != 0) {
      ppcVar6 = (char **)0x0;
      do {
        ppcVar6 = (char **)((ulong)ppcVar6 | (ulong)local_50 ^ (ulong)pDVar1 & 0xfffffffffffffffe);
        iVar3 = st__gen(gen,&local_50,(char **)0x0);
      } while (iVar3 != 0);
    }
    st__free_gen(gen);
    uVar7 = 0;
    do {
      names = (char **)(ulong)(uint)~(-1 << ((byte)uVar7 & 0x1f));
      if (ppcVar6 <= names) break;
      bVar8 = uVar7 < 0x3c;
      uVar7 = uVar7 + 4;
    } while (bVar8);
    st__free_table((st__table *)fp_00);
    fp_00 = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
    if (fp_00 != (FILE *)0x0) {
      uVar7 = 0;
      iVar3 = fprintf((FILE *)fp,"[");
      if (iVar3 != -1) {
        if (0 < n) {
          local_48 = (ulong)(n - 1);
          uVar5 = 0;
          do {
            if (onames == (char **)0x0) {
              iVar3 = fprintf((FILE *)fp,"l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                              uVar5 & 0xffffffff,uVar5 & 0xffffffff);
            }
            else {
              iVar3 = fprintf((FILE *)fp,"l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",onames[uVar5]
                             );
            }
            ppDVar2 = local_40;
            if (iVar3 == -1) {
              uVar7 = 0;
              goto LAB_007d63bf;
            }
            pcVar4 = "red";
            if (((ulong)local_40[uVar5] & 1) == 0) {
              pcVar4 = "blue";
            }
            uVar7 = 0;
            iVar3 = fprintf((FILE *)fp,"[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],"
                            ,pcVar4);
            if ((iVar3 == -1) ||
               (iVar3 = ddDoDumpDaVinci((DdManager *)((ulong)ppDVar2[uVar5] & 0xfffffffffffffffe),
                                        (DdNode *)fp,fp_00,local_38,names,(ptruint)mask), iVar3 == 0
               )) goto LAB_007d63bf;
            pcVar4 = ",";
            if (local_48 == uVar5) {
              pcVar4 = "";
            }
            uVar7 = 0;
            iVar3 = fprintf((FILE *)fp,")]))%s",pcVar4);
            if (iVar3 == -1) goto LAB_007d63bf;
            uVar5 = uVar5 + 1;
          } while ((uint)n != uVar5);
        }
        iVar3 = fprintf((FILE *)fp,"]\n");
        uVar7 = (uint)(iVar3 != -1);
      }
LAB_007d63bf:
      st__free_table((st__table *)fp_00);
      return uVar7;
    }
  }
  return 0;
}

Assistant:

int
Cudd_DumpDaVinci(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,
                             "l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                             i,i);
        } else {
            retval = fprintf(fp,
                             "l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",
                             onames[i], onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],",
                         Cudd_IsComplement(f[i]) ? "red" : "blue");
        if (retval == EOF) goto failure;
        retval = ddDoDumpDaVinci(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        retval = fprintf(fp, ")]))%s", i == n-1 ? "" : ",");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    return(1);

failure:
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}